

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MCRegisterInfo.c
# Opt level: O2

uint MCRegisterInfo_getMatchingSuperReg(MCRegisterInfo *RI,uint Reg,uint SubIdx,MCRegisterClass *RC)

{
  ushort uVar1;
  _Bool _Var2;
  uint uVar3;
  uint Reg_00;
  ushort *puVar4;
  uint16_t val;
  ulong uVar5;
  
  Reg_00 = 0;
  if (Reg < RI->NumRegs) {
    uVar5 = (ulong)Reg;
    puVar4 = (ushort *)0x0;
    if (RI->DiffLists == (MCPhysReg *)0x0) goto LAB_00146686;
    puVar4 = RI->DiffLists + RI->Desc[uVar5].SuperRegs;
    do {
      uVar1 = *puVar4;
      uVar5 = (ulong)((int)uVar5 + (uint)uVar1);
      puVar4 = puVar4 + 1;
      if (uVar1 == 0) {
        puVar4 = (ushort *)0x0;
      }
LAB_00146686:
      if (puVar4 == (ushort *)0x0) {
        return 0;
      }
      Reg_00 = (uint)uVar5 & 0xffff;
      _Var2 = MCRegisterClass_contains(RC,Reg_00);
    } while ((!_Var2) || (uVar3 = MCRegisterInfo_getSubReg(RI,Reg_00,SubIdx), uVar3 != Reg));
  }
  return Reg_00;
}

Assistant:

unsigned MCRegisterInfo_getMatchingSuperReg(MCRegisterInfo *RI, unsigned Reg, unsigned SubIdx, MCRegisterClass *RC)
{
	DiffListIterator iter;

	if (Reg >= RI->NumRegs) {
		return 0;
	}

	DiffListIterator_init(&iter, (MCPhysReg)Reg, RI->DiffLists + RI->Desc[Reg].SuperRegs);
	DiffListIterator_next(&iter);

	while(DiffListIterator_isValid(&iter)) {
		uint16_t val = DiffListIterator_getVal(&iter);
		if (MCRegisterClass_contains(RC, val) && Reg ==  MCRegisterInfo_getSubReg(RI, val, SubIdx))
			return val;

		DiffListIterator_next(&iter);
	}

	return 0;
}